

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::visitIfStatementAstNode
          (CompilerAstWalker *this,IfStatementAstNode *node)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type local_28;
  size_type local_20;
  IfStatementAstNode *local_18;
  IfStatementAstNode *node_local;
  CompilerAstWalker *this_local;
  
  local_18 = node;
  node_local = (IfStatementAstNode *)this;
  (*(this->super_AstWalker)._vptr_AstWalker[0x16])(this,node);
  peVar2 = std::__shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(local_18->expression).
                       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_AstWalker)._vptr_AstWalker[3])(this,peVar2);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  peVar4 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  local_20 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                       (&peVar4->byteCode);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&peVar3->ifConditionEvalJumpIndices,&local_20);
  emit(this,JumpIfFalse);
  peVar5 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(local_18->ifStatement).
                       super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_AstWalker)._vptr_AstWalker[2])(this,peVar5);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_18->elseStatement);
  if (bVar1) {
    emit(this,Jump);
    peVar3 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    peVar4 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    local_28 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                         (&peVar4->byteCode);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&peVar3->elseStatementStartIndex,&local_28);
    this_00 = &std::optional<std::shared_ptr<StatementAstNode>_>::operator->
                         (&local_18->elseStatement)->
               super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>;
    peVar5 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    (*(this->super_AstWalker)._vptr_AstWalker[2])(this,peVar5);
  }
  (*(this->super_AstWalker)._vptr_AstWalker[0x25])(this,local_18);
  return;
}

Assistant:

void visitIfStatementAstNode(IfStatementAstNode* node) noexcept override {
    this->onEnterIfStatementAstNode(node);
    this->visitExpressionAstNode(node->expression.get());
    this->ec->ifConditionEvalJumpIndices.push_back(this->ec->byteCode.size());
    this->emit(bytecode::ByteCodeInstruction::JumpIfFalse);
    this->visitStatementAstNode(node->ifStatement.get());
    if (node->elseStatement) {
      this->emit(bytecode::ByteCodeInstruction::Jump);
      this->ec->elseStatementStartIndex.push_back(this->ec->byteCode.size());
      this->visitStatementAstNode(node->elseStatement->get());
    }
    this->onExitIfStatementAstNode(node);
  }